

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_legacy_abi_cxx11_
          (CompilerHLSL *this,SPIRType *type,uint32_t param_2)

{
  int iVar1;
  uint32_t id;
  SPIRType *pSVar2;
  CompilerError *this_00;
  undefined4 in_register_00000014;
  long lVar3;
  char *pcVar4;
  allocator local_a9;
  string local_a8 [36];
  undefined4 local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [48];
  string local_50 [8];
  string res;
  SPIRType *imagetype;
  uint32_t param_2_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  lVar3 = CONCAT44(in_register_00000014,param_2);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)(lVar3 + 0xf8));
  pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,id);
  ::std::__cxx11::string::string(local_50);
  iVar1 = *(int *)&(pSVar2->super_IVariant).field_0xc;
  if (iVar1 == 7) {
    ::std::__cxx11::string::operator=(local_50,"i");
  }
  else if (iVar1 == 8) {
    ::std::__cxx11::string::operator=(local_50,"u");
  }
  if ((*(int *)(lVar3 + 0xc) == 0x10) && (*(int *)(lVar3 + 0xfc) == 6)) {
    ::std::operator+(local_80,(char *)local_50);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_80);
    ::std::__cxx11::string::~string((string *)local_80);
  }
  else {
    if ((*(int *)(lVar3 + 0xc) == 0x10) && (*(int *)(lVar3 + 0xfc) != 6)) {
      if ((*(int *)(lVar3 + 0xfc) == 5) && (*(int *)(lVar3 + 0x104) == 1)) {
        ::std::__cxx11::string::operator+=(local_50,"sampler");
      }
      else {
        pcVar4 = "texture";
        if (*(int *)(lVar3 + 0x104) == 2) {
          pcVar4 = "image";
        }
        ::std::__cxx11::string::operator+=(local_50,pcVar4);
      }
    }
    else {
      ::std::__cxx11::string::operator+=(local_50,"sampler");
    }
    switch(*(undefined4 *)(lVar3 + 0xfc)) {
    case 0:
      ::std::__cxx11::string::operator+=(local_50,"1D");
      break;
    case 1:
      ::std::__cxx11::string::operator+=(local_50,"2D");
      break;
    case 2:
      ::std::__cxx11::string::operator+=(local_50,"3D");
      break;
    case 3:
      ::std::__cxx11::string::operator+=(local_50,"CUBE");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_a8,"Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.",
                 &local_a9);
      CompilerError::CompilerError(this_00,(string *)local_a8);
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case 5:
      ::std::__cxx11::string::operator+=(local_50,"Buffer");
      break;
    case 6:
      ::std::__cxx11::string::operator+=(local_50,"2D");
    }
    if ((*(byte *)(lVar3 + 0x102) & 1) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"MS");
    }
    if ((*(byte *)(lVar3 + 0x101) & 1) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"Array");
    }
    ::std::__cxx11::string::string((string *)this,local_50);
  }
  local_84 = 1;
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CompilerHLSL::image_type_hlsl_legacy(const SPIRType &type, uint32_t /*id*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
		res = "i";
		break;
	case SPIRType::UInt:
		res = "u";
		break;
	default:
		break;
	}

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "CUBE";
		break;

	case DimBuffer:
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
		res += "Array";

	return res;
}